

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O2

DUH * dumb_read_riff_amff(DUMBFILE *f,riff *stream)

{
  riff_chunk *prVar1;
  char cVar2;
  uchar uVar3;
  int iVar4;
  int32 iVar5;
  int iVar6;
  int32 iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int32 iVar11;
  DUMB_IT_SIGDATA *sigdata_00;
  IT_PATTERN *pIVar12;
  IT_SAMPLE *pIVar13;
  uchar *puVar14;
  void *pvVar15;
  DUH *pDVar16;
  sbyte sVar17;
  ulong uVar18;
  uchar uVar19;
  byte bVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  
  descptr = &_dumb_sigtype_it;
  if ((stream != (riff *)0x0) && (stream->type == 0x414d4646)) {
    sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138);
    uVar23 = 0;
    if (sigdata_00 == (DUMB_IT_SIGDATA *)0x0) {
      return (DUH *)0x0;
    }
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    lVar24 = 8;
    uVar22 = 0;
    while( true ) {
      uVar18 = (ulong)stream->chunk_count;
      if (uVar18 <= uVar22) break;
      prVar1 = stream->chunks;
      iVar4 = *(int *)((long)prVar1 + lVar24 + -8);
      if (iVar4 == 0x494e5354) {
        if ((*(uint *)((long)&prVar1->type + lVar24) < 0xe1) ||
           (iVar4 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar24 + -4) + 1,0), iVar4 != 0))
        goto LAB_0057d84b;
        iVar4 = dumbfile_getc(f);
        if (sigdata_00->n_samples <= iVar4) {
          sigdata_00->n_samples = iVar4 + 1;
        }
        if ((0x120 < *(uint *)((long)&prVar1->type + lVar24)) &&
           ((iVar4 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar24 + -4) + 0xe1,0),
            iVar4 != 0 ||
            ((iVar5 = dumbfile_mgetl(f), iVar5 == 0x53414d50 &&
             (iVar5 = dumbfile_igetl(f), *(uint *)((long)&prVar1->type + lVar24) < iVar5 + 0xe9U))))
           )) goto LAB_0057d84b;
      }
      else if (iVar4 == 0x50415454) {
        iVar4 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar24 + -4),0);
        if (iVar4 != 0) goto LAB_0057d84b;
        iVar4 = dumbfile_getc(f);
        if (sigdata_00->n_patterns <= iVar4) {
          sigdata_00->n_patterns = iVar4 + 1;
        }
        iVar5 = dumbfile_igetl(f);
        if (*(uint *)((long)&prVar1->type + lVar24) < iVar5 + 5U) goto LAB_0057d84b;
      }
      else if (iVar4 == 0x4f524452) {
        if (((uVar23 & 2) != 0) || (*(int *)((long)&prVar1->type + lVar24) == 0)) goto LAB_0057d84b;
        uVar23 = uVar23 | 2;
      }
      else if (iVar4 == 0x4d41494e) {
        if (((uVar23 & 1) != 0) || (*(uint *)((long)&prVar1->type + lVar24) < 0x48))
        goto LAB_0057d84b;
        uVar23 = uVar23 | 1;
      }
      uVar22 = uVar22 + 1;
      lVar24 = lVar24 + 0x18;
    }
    if ((((uVar23 == 3) && (sigdata_00->n_samples != 0)) && (sigdata_00->n_patterns < 0x100)) &&
       ((sigdata_00->n_samples < 0x100 && (sigdata_00->n_patterns != 0)))) {
      sigdata_00->song_message = (uchar *)0x0;
      sigdata_00->n_orders = 0;
      sigdata_00->n_instruments = 0;
      sigdata_00->order = (uchar *)0x0;
      sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
      sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
      sigdata_00->sample = (IT_SAMPLE *)0x0;
      sigdata_00->pattern = (IT_PATTERN *)0x0;
      sigdata_00->midi = (IT_MIDI *)0x0;
      sigdata_00->mixing_volume = 0x30;
      sigdata_00->pan_separation = 0x80;
      sigdata_00->restart_position = '\0';
      builtin_memcpy(sigdata_00->channel_volume,
                     "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
      cVar2 = (char)((dumb_it_default_panning_separation << 5) / 100);
      uVar19 = ' ' - cVar2;
      uVar3 = cVar2 + ' ';
      for (uVar22 = 0; uVar22 < 0x40; uVar22 = uVar22 + 4) {
        sigdata_00->channel_pan[uVar22] = uVar19;
        sigdata_00->channel_pan[uVar22 + 1] = uVar3;
        sigdata_00->channel_pan[uVar22 + 2] = uVar3;
        sigdata_00->channel_pan[uVar22 + 3] = uVar19;
      }
      for (uVar22 = 0; uVar22 < uVar18; uVar22 = uVar22 + 1) {
        prVar1 = stream->chunks;
        if (prVar1[uVar22].type == 0x4d41494e) {
          iVar4 = dumbfile_seek(f,(long)prVar1[uVar22].offset,0);
          if (iVar4 != 0) goto LAB_0057dd68;
          dumbfile_getnc((char *)sigdata_00,0x40,f);
          sigdata_00->name[0x40] = '\0';
          sigdata_00->flags = 0x131;
          uVar23 = dumbfile_getc(f);
          if ((uVar23 & 1) == 0) {
            *(byte *)&sigdata_00->flags = (byte)sigdata_00->flags | 8;
          }
          if ((uVar23 & 0xfffffffe) != 2) goto LAB_0057dd68;
          iVar4 = dumbfile_getc(f);
          sigdata_00->n_pchannels = iVar4;
          iVar4 = dumbfile_getc(f);
          sigdata_00->speed = iVar4;
          iVar4 = dumbfile_getc(f);
          sigdata_00->tempo = iVar4;
          dumbfile_skip(f,4);
          iVar4 = dumbfile_getc(f);
          sigdata_00->global_volume = iVar4;
          iVar4 = sigdata_00->n_pchannels;
          if (prVar1[uVar22].size < iVar4 + 0x48U) goto LAB_0057dd68;
          for (lVar24 = 0; lVar24 < iVar4; lVar24 = lVar24 + 1) {
            iVar4 = dumbfile_getc(f);
            sigdata_00->channel_pan[lVar24] = (uchar)iVar4;
            if (0x7f < iVar4) {
              sigdata_00->channel_volume[lVar24] = '\0';
            }
            iVar4 = sigdata_00->n_pchannels;
          }
          uVar18 = (ulong)stream->chunk_count;
        }
      }
      uVar23 = sigdata_00->n_patterns;
      pIVar12 = (IT_PATTERN *)malloc((long)(int)uVar23 << 4);
      sigdata_00->pattern = pIVar12;
      if (pIVar12 != (IT_PATTERN *)0x0) {
        uVar18 = 0;
        uVar22 = (ulong)uVar23;
        if ((int)uVar23 < 1) {
          uVar22 = uVar18;
        }
        for (; uVar22 * 0x10 != uVar18; uVar18 = uVar18 + 0x10) {
          *(undefined8 *)((long)&pIVar12->entry + uVar18) = 0;
        }
        uVar22 = (ulong)sigdata_00->n_samples;
        pIVar13 = (IT_SAMPLE *)malloc(uVar22 * 0x68);
        sigdata_00->sample = pIVar13;
        if (pIVar13 != (IT_SAMPLE *)0x0) {
          lVar24 = 0;
          for (lVar21 = 0; lVar21 < (int)uVar22; lVar21 = lVar21 + 1) {
            pIVar13 = sigdata_00->sample;
            puVar14 = pIVar13->filename + lVar24 + 0x35;
            puVar14[0] = '\0';
            puVar14[1] = '\0';
            puVar14[2] = '\0';
            puVar14[3] = '\0';
            puVar14[4] = '\0';
            puVar14[5] = '\0';
            puVar14[6] = '\0';
            puVar14[7] = '\0';
            pIVar13->filename[lVar24 + 0xf] = '\0';
            pIVar13->name[lVar24] = '\0';
            uVar22 = (ulong)(uint)sigdata_00->n_samples;
            lVar24 = lVar24 + 0x68;
          }
          lVar24 = 8;
          uVar22 = 0;
          do {
            if (stream->chunk_count <= uVar22) {
              _dumb_it_fix_invalid_orders(sigdata_00);
              tag[0][0] = "TITLE";
              tag[1][0] = "FORMAT";
              tag[1][1] = "RIFF AMFF";
              sigdata = sigdata_00;
              tag[0][1] = (char *)sigdata_00;
              pDVar16 = make_duh(0,2,tag,1,&descptr,&sigdata);
              return pDVar16;
            }
            prVar1 = stream->chunks;
            iVar4 = *(int *)((long)prVar1 + lVar24 + -8);
            if (iVar4 == 0x494e5354) {
              iVar4 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar24 + -4) + 1,0);
              if (iVar4 != 0) break;
              pIVar13 = sigdata_00->sample;
              iVar4 = dumbfile_getc(f);
              pIVar13 = pIVar13 + iVar4;
              if (0x120 < *(uint *)((long)&prVar1->type + lVar24)) {
                iVar4 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar24 + -4) + 0xe1,0);
                if (iVar4 != 0) break;
                iVar5 = dumbfile_mgetl(f);
                if (iVar5 == 0x53414d50) {
                  iVar5 = dumbfile_igetl(f);
                  iVar7 = dumbfile_pos(f);
                  if (0x37 < iVar5) {
                    dumbfile_getnc((char *)pIVar13,0x1c,f);
                    pIVar13->name[0x1c] = '\0';
                    iVar4 = dumbfile_getc(f);
                    iVar6 = dumbfile_getc(f);
                    uVar8 = dumbfile_igetw(f);
                    uVar23 = dumbfile_igetl(f);
                    uVar9 = dumbfile_igetl(f);
                    uVar10 = dumbfile_igetl(f);
                    iVar11 = dumbfile_igetl(f);
                    if (uVar23 == 0) {
                      pIVar13->flags = pIVar13->flags & 0xfe;
                      goto LAB_0057dd56;
                    }
                    if ((uVar8 & 0xffff7f43) == 0) {
                      sVar17 = (sbyte)((uVar8 & 4) >> 2);
                      if ((int)((uVar23 << sVar17) + 0x38) <= iVar5) {
                        bVar20 = (byte)((uVar8 & 4) >> 1) | (byte)uVar8 >> 7;
                        pIVar13->flags = bVar20;
                        pIVar13->length = uVar23;
                        pIVar13->loop_start = uVar9;
                        pIVar13->loop_end = uVar10;
                        pIVar13->C5_speed = iVar11;
                        pIVar13->default_volume = (uchar)iVar6;
                        pIVar13->default_pan = (byte)((uVar8 & 0x20) << 2) | (byte)iVar4;
                        pIVar13->filename[0] = '\0';
                        pIVar13->global_volume = '@';
                        pIVar13->vibrato_speed = '\0';
                        pIVar13->vibrato_depth = '\0';
                        pIVar13->vibrato_rate = '\0';
                        pIVar13->vibrato_waveform = '\0';
                        pIVar13->finetune = 0;
                        pIVar13->max_resampling_quality = -1;
                        if ((uVar9 < uVar10 & (byte)uVar8 >> 3 & uVar10 <= uVar23) == 1) {
                          pIVar13->length = uVar10;
                          pIVar13->flags = bVar20 + 0x10;
                          uVar23 = uVar10;
                          if ((uVar8 & 0x10) != 0) {
                            pIVar13->flags = bVar20 | 0x50;
                          }
                        }
                        iVar4 = uVar23 << sVar17;
                        pvVar15 = malloc((long)iVar4);
                        pIVar13->data = pvVar15;
                        if ((pvVar15 != (void *)0x0) &&
                           (iVar6 = dumbfile_seek(f,(long)(iVar7 + 0x38),0), iVar6 == 0)) {
                          puVar14 = (uchar *)pIVar13->data;
                          goto LAB_0057daa3;
                        }
                      }
                    }
                  }
                  break;
                }
              }
              dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar24 + -4) + 2,0);
              dumbfile_getnc((char *)pIVar13,0x1c,f);
              pIVar13->name[0x1c] = '\0';
            }
            else if (iVar4 == 0x50415454) {
              iVar4 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar24 + -4),0);
              if (iVar4 != 0) break;
              iVar4 = dumbfile_getc(f);
              iVar5 = dumbfile_igetl(f);
              iVar4 = it_riff_am_process_pattern(sigdata_00->pattern + iVar4,f,iVar5,0);
              if (iVar4 != 0) break;
            }
            else if (iVar4 == 0x4f524452) {
              iVar4 = dumbfile_seek(f,(long)*(int *)((long)prVar1 + lVar24 + -4),0);
              if (iVar4 != 0) break;
              iVar6 = dumbfile_getc(f);
              iVar4 = iVar6 + 1;
              sigdata_00->n_orders = iVar4;
              if (*(uint *)((long)&prVar1->type + lVar24) < iVar6 + 2U) break;
              puVar14 = (uchar *)malloc((long)iVar4);
              sigdata_00->order = puVar14;
              if (puVar14 == (uchar *)0x0) break;
LAB_0057daa3:
              dumbfile_getnc((char *)puVar14,iVar4,f);
            }
LAB_0057dd56:
            uVar22 = uVar22 + 1;
            lVar24 = lVar24 + 0x18;
          } while( true );
        }
      }
LAB_0057dd68:
      _dumb_it_unload_sigdata(sigdata_00);
    }
    else {
LAB_0057d84b:
      free(sigdata_00);
    }
  }
  return (DUH *)0x0;
}

Assistant:

DUH *dumb_read_riff_amff( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;
	long length;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_amff_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	length = 0;/*_dumb_it_build_checkpoints(sigdata, 0);*/

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF AMFF";
		return make_duh( length, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}